

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

SparseTextureProperties *
Diligent::GetStandardSparseTextureProperties
          (SparseTextureProperties *__return_storage_ptr__,TextureDesc *TexDesc)

{
  bool bVar1;
  Uint32 UVar2;
  TextureFormatAttribs *this;
  Char *pCVar3;
  uint *puVar4;
  type tVar5;
  char (*in_RCX) [54];
  char (*Args_1) [46];
  uint3 uVar6;
  Uint64 local_328;
  bool local_311;
  sbyte local_304;
  undefined1 local_2b0 [8];
  string msg_11;
  string msg_10;
  string msg_9;
  uint local_248;
  Box local_23c;
  undefined8 local_224;
  uint3 NumTilesInMip;
  bool IsUnpacked;
  Uint32 MipDepth;
  Uint32 MipHeight;
  Uint32 MipWidth;
  MipLevelProperties MipProps;
  Uint64 UStack_1d0;
  Uint32 Mip;
  Uint64 SliceSize;
  string msg_8;
  uint local_1a0;
  Uint32 BytesPerTile;
  Uint32 i_3;
  Uint32 i_2;
  size_t Remap_2 [2];
  uint local_17c;
  undefined8 uStack_178;
  Uint32 i_1;
  size_t Remap_1 [2];
  undefined1 local_160 [8];
  string msg_7;
  string msg_6;
  undefined8 uStack_118;
  Uint32 i;
  size_t Remap [3];
  undefined1 local_f8 [8];
  string msg_5;
  string msg_4;
  string msg_3;
  string msg_2;
  string msg_1;
  undefined1 local_48 [8];
  string msg;
  Uint32 TexelSize;
  TextureFormatAttribs *FmtAttribs;
  Uint32 SparseBlockSize;
  TextureDesc *TexDesc_local;
  
  this = GetTextureFormatAttribs(TexDesc->Format);
  msg.field_2._12_4_ = TextureFormatAttribs::GetElementSize(this);
  bVar1 = IsPowerOfTwo<unsigned_int>(msg.field_2._12_4_);
  if (!bVar1) {
    FormatString<char[26],char[24]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"IsPowerOfTwo(TexelSize)",(char (*) [24])in_RCX);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [54])0xb34;
    DebugAssertionFailed
              (pCVar3,"GetStandardSparseTextureProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0xb34);
    std::__cxx11::string::~string((string *)local_48);
  }
  if ((msg.field_2._12_4_ == 0) || (0x10 < (uint)msg.field_2._12_4_)) {
    FormatString<char[26],char[34]>
              ((string *)((long)&msg_2.field_2 + 8),(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"TexelSize >= 1 && TexelSize <= 16",(char (*) [34])in_RCX);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [54])0xb35;
    DebugAssertionFailed
              (pCVar3,"GetStandardSparseTextureProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0xb35);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  bVar1 = TextureDesc::Is2D(TexDesc);
  if ((!bVar1) && (bVar1 = TextureDesc::Is3D(TexDesc), !bVar1)) {
    FormatString<char[26],char[33]>
              ((string *)((long)&msg_3.field_2 + 8),(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"TexDesc.Is2D() || TexDesc.Is3D()",(char (*) [33])in_RCX);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [54])0xb36;
    DebugAssertionFailed
              (pCVar3,"GetStandardSparseTextureProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0xb36);
    std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
  }
  if (TexDesc->MipLevels == 0) {
    FormatString<char[46]>
              ((string *)((long)&msg_4.field_2 + 8),
               (char (*) [46])"Number of mipmap calculation is not supported");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [54])0xb37;
    DebugAssertionFailed
              (pCVar3,"GetStandardSparseTextureProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0xb37);
    std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
  }
  if ((TexDesc->SampleCount != 1) && (TexDesc->MipLevels != 1)) {
    FormatString<char[44]>
              ((string *)((long)&msg_5.field_2 + 8),
               (char (*) [44])"Multisampled textures must have 1 mip level");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [54])0xb38;
    DebugAssertionFailed
              (pCVar3,"GetStandardSparseTextureProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0xb38);
    std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
  }
  SparseTextureProperties::SparseTextureProperties(__return_storage_ptr__);
  bVar1 = TextureDesc::Is3D(TexDesc);
  if (bVar1) {
    if (this->ComponentType == COMPONENT_TYPE_COMPRESSED) {
      FormatString<char[58]>
                ((string *)local_f8,
                 (char (*) [58])"Compressed sparse 3D textures are currently not supported");
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"GetStandardSparseTextureProperties",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0xb3e);
      std::__cxx11::string::~string((string *)local_f8);
    }
    __return_storage_ptr__->TileSize[0] = 0x40;
    __return_storage_ptr__->TileSize[1] = 0x20;
    __return_storage_ptr__->TileSize[2] = 0x20;
    uStack_118 = 0;
    Remap[0] = 2;
    Remap[1] = 1;
    for (msg_6.field_2._12_4_ = 0;
        (uint)(1 << ((byte)msg_6.field_2._12_4_ & 0x1f)) < (uint)msg.field_2._12_4_;
        msg_6.field_2._12_4_ = msg_6.field_2._12_4_ + 1) {
      __return_storage_ptr__->TileSize
      [*(long *)(local_f8 + ((ulong)(uint)msg_6.field_2._12_4_ % 3) * 8 + -0x20)] =
           __return_storage_ptr__->TileSize
           [*(long *)(local_f8 + ((ulong)(uint)msg_6.field_2._12_4_ % 3) * 8 + -0x20)] >> 1;
    }
  }
  else if (TexDesc->SampleCount < 2) {
    __return_storage_ptr__->TileSize[0] = 0x100;
    __return_storage_ptr__->TileSize[1] = 0x100;
    __return_storage_ptr__->TileSize[2] = 1;
    if (this->ComponentType == COMPONENT_TYPE_COMPRESSED) {
      for (local_1a0 = 0;
          (int)((uint)this->ComponentSize << ((byte)local_1a0 & 0x1f)) <
          (int)((uint)this->BlockWidth * (uint)this->BlockHeight); local_1a0 = local_1a0 + 1) {
        __return_storage_ptr__->TileSize[local_1a0 & 1] =
             __return_storage_ptr__->TileSize[local_1a0 & 1] << 1;
      }
    }
    else {
      _i_3 = 1;
      Remap_2[0] = 0;
      for (BytesPerTile = 0; (uint)(1 << ((byte)BytesPerTile & 0x1f)) < (uint)msg.field_2._12_4_;
          BytesPerTile = BytesPerTile + 1) {
        __return_storage_ptr__->TileSize[*(long *)(&i_3 + (ulong)(BytesPerTile & 1) * 2)] =
             __return_storage_ptr__->TileSize[*(long *)(&i_3 + (ulong)(BytesPerTile & 1) * 2)] >> 1;
      }
    }
  }
  else {
    if (this->ComponentType == COMPONENT_TYPE_COMPRESSED) {
      FormatString<char[26],char[54]>
                ((string *)((long)&msg_7.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"FmtAttribs.ComponentType != COMPONENT_TYPE_COMPRESSED",in_RCX);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      in_RCX = (char (*) [54])0xb53;
      DebugAssertionFailed
                (pCVar3,"GetStandardSparseTextureProperties",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0xb53);
      std::__cxx11::string::~string((string *)(msg_7.field_2._M_local_buf + 8));
    }
    bVar1 = IsPowerOfTwo<unsigned_int>(TexDesc->SampleCount);
    if (!bVar1) {
      FormatString<char[26],char[34]>
                ((string *)local_160,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"IsPowerOfTwo(TexDesc.SampleCount)",(char (*) [34])in_RCX);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"GetStandardSparseTextureProperties",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0xb5c);
      std::__cxx11::string::~string((string *)local_160);
    }
    __return_storage_ptr__->TileSize[0] = 0x80 >> (7 < TexDesc->SampleCount);
    if (TexDesc->SampleCount < 4) {
      local_304 = 0;
    }
    else {
      local_304 = 1;
      if (0xf < TexDesc->SampleCount) {
        local_304 = 2;
      }
    }
    __return_storage_ptr__->TileSize[1] = 0x100 >> local_304;
    __return_storage_ptr__->TileSize[2] = 1;
    uStack_178 = 1;
    Remap_1[0] = 0;
    for (local_17c = 0; (uint)(1 << ((byte)local_17c & 0x1f)) < (uint)msg.field_2._12_4_;
        local_17c = local_17c + 1) {
      __return_storage_ptr__->TileSize
      [*(long *)((long)&stack0xfffffffffffffe88 + (ulong)(local_17c & 1) * 8)] =
           __return_storage_ptr__->TileSize
           [*(long *)((long)&stack0xfffffffffffffe88 + (ulong)(local_17c & 1) * 8)] >> 1;
    }
  }
  msg_8.field_2._12_4_ =
       (__return_storage_ptr__->TileSize[0] / (uint)this->BlockWidth) *
       (__return_storage_ptr__->TileSize[1] / (uint)this->BlockHeight) *
       __return_storage_ptr__->TileSize[2] * TexDesc->SampleCount * msg.field_2._12_4_;
  if (msg_8.field_2._12_4_ != 0x10000) {
    FormatString<char[26],char[32]>
              ((string *)&SliceSize,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"BytesPerTile == SparseBlockSize",(char (*) [32])TexDesc);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"GetStandardSparseTextureProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0xb88);
    std::__cxx11::string::~string((string *)&SliceSize);
  }
  UStack_1d0 = 0;
  __return_storage_ptr__->FirstMipInTail = 0xffffffff;
  for (MipProps.MipSize._4_4_ = 0; MipProps.MipSize._4_4_ < TexDesc->MipLevels;
      MipProps.MipSize._4_4_ = MipProps.MipSize._4_4_ + 1) {
    GetMipLevelProperties((MipLevelProperties *)&MipHeight,TexDesc,MipProps.MipSize._4_4_);
    NumTilesInMip.field_0.field_0.z = MipProps.StorageWidth;
    local_311 = false;
    if ((__return_storage_ptr__->TileSize[0] <= MipProps.LogicalWidth) &&
       (local_311 = false, __return_storage_ptr__->TileSize[1] <= MipProps.LogicalHeight)) {
      local_311 = __return_storage_ptr__->TileSize[2] <= MipProps.StorageWidth;
    }
    NumTilesInMip.field_0.field_0.y._3_1_ = local_311;
    if (local_311 == false) {
      if (__return_storage_ptr__->FirstMipInTail == 0xffffffff) {
        __return_storage_ptr__->FirstMipInTail = MipProps.MipSize._4_4_;
        __return_storage_ptr__->MipTailOffset = UStack_1d0;
      }
      __return_storage_ptr__->MipTailSize =
           MipProps.DepthSliceSize + __return_storage_ptr__->MipTailSize;
    }
    else {
      Box::Box(&local_23c,0,MipProps.LogicalWidth,0,MipProps.LogicalHeight,0,MipProps.StorageWidth);
      uVar6 = GetNumSparseTilesInBox(&local_23c,__return_storage_ptr__->TileSize);
      msg_9.field_2._8_8_ = uVar6.field_0._0_8_;
      local_224 = msg_9.field_2._8_8_;
      local_248 = uVar6.field_0._8_4_;
      NumTilesInMip.field_0.field_0.x = local_248;
      UStack_1d0 = (msg_9.field_2._8_8_ & 0xffffffff) * ((ulong)msg_9.field_2._8_8_ >> 0x20) *
                   (ulong)local_248 * 0x10000 + UStack_1d0;
    }
  }
  puVar4 = std::min<unsigned_int>(&__return_storage_ptr__->FirstMipInTail,&TexDesc->MipLevels);
  __return_storage_ptr__->FirstMipInTail = *puVar4;
  tVar5 = AlignUp<unsigned_long,unsigned_int>(__return_storage_ptr__->MipTailSize,0x10000);
  __return_storage_ptr__->MipTailSize = tVar5;
  UStack_1d0 = UStack_1d0 + __return_storage_ptr__->MipTailSize;
  bVar1 = TextureDesc::IsArray(TexDesc);
  local_328 = UStack_1d0;
  if (!bVar1) {
    local_328 = 0;
  }
  __return_storage_ptr__->MipTailStride = local_328;
  UVar2 = TextureDesc::GetArraySize(TexDesc);
  Args_1 = (char (*) [46])(UStack_1d0 * UVar2);
  __return_storage_ptr__->AddressSpaceSize = (Uint64)Args_1;
  __return_storage_ptr__->BlockSize = 0x10000;
  __return_storage_ptr__->Flags = SPARSE_TEXTURE_FLAG_NONE;
  if ((__return_storage_ptr__->MipTailSize & 0xffff) != 0) {
    FormatString<char[26],char[41]>
              ((string *)((long)&msg_10.field_2 + 8),(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Props.MipTailSize % SparseBlockSize == 0",(char (*) [41])Args_1);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    Args_1 = (char (*) [46])0xbb3;
    DebugAssertionFailed
              (pCVar3,"GetStandardSparseTextureProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0xbb3);
    std::__cxx11::string::~string((string *)(msg_10.field_2._M_local_buf + 8));
  }
  if ((__return_storage_ptr__->MipTailStride & 0xffff) != 0) {
    FormatString<char[26],char[43]>
              ((string *)((long)&msg_11.field_2 + 8),(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Props.MipTailStride % SparseBlockSize == 0",(char (*) [43])Args_1);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    Args_1 = (char (*) [46])0xbb4;
    DebugAssertionFailed
              (pCVar3,"GetStandardSparseTextureProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0xbb4);
    std::__cxx11::string::~string((string *)(msg_11.field_2._M_local_buf + 8));
  }
  if ((__return_storage_ptr__->AddressSpaceSize & 0xffff) != 0) {
    FormatString<char[26],char[46]>
              ((string *)local_2b0,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Props.AddressSpaceSize % SparseBlockSize == 0",Args_1);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"GetStandardSparseTextureProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0xbb5);
    std::__cxx11::string::~string((string *)local_2b0);
  }
  return __return_storage_ptr__;
}

Assistant:

SparseTextureProperties GetStandardSparseTextureProperties(const TextureDesc& TexDesc)
{
    constexpr Uint32            SparseBlockSize = 64 << 10;
    const TextureFormatAttribs& FmtAttribs      = GetTextureFormatAttribs(TexDesc.Format);
    const Uint32                TexelSize       = FmtAttribs.GetElementSize();
    VERIFY_EXPR(IsPowerOfTwo(TexelSize));
    VERIFY_EXPR(TexelSize >= 1 && TexelSize <= 16);
    VERIFY_EXPR(TexDesc.Is2D() || TexDesc.Is3D());
    VERIFY(TexDesc.MipLevels > 0, "Number of mipmap calculation is not supported");
    VERIFY(TexDesc.SampleCount == 1 || TexDesc.MipLevels == 1, "Multisampled textures must have 1 mip level");

    SparseTextureProperties Props;

    if (TexDesc.Is3D())
    {
        DEV_CHECK_ERR(FmtAttribs.ComponentType != COMPONENT_TYPE_COMPRESSED, "Compressed sparse 3D textures are currently not supported");

        //  | Texel size  |    Tile shape   |
        //  |-------------|-----------------|
        //  |     8-Bit   |   64 x 32 x 32  |
        //  |    16-Bit   |   32 x 32 x 32  |
        //  |    32-Bit   |   32 x 32 x 16  |
        //  |    64-Bit   |   32 x 16 x 16  |
        //  |   128-Bit   |   16 x 16 x 16  |
        Props.TileSize[0] = 64;
        Props.TileSize[1] = 32;
        Props.TileSize[2] = 32;

        constexpr size_t Remap[] = {0, 2, 1};
        for (Uint32 i = 0; (1u << i) < TexelSize; ++i)
        {
            Props.TileSize[Remap[i % 3]] /= 2;
        }
    }
    else if (TexDesc.SampleCount > 1)
    {
        VERIFY_EXPR(FmtAttribs.ComponentType != COMPONENT_TYPE_COMPRESSED);

        //  | Texel size  |   Tile shape 2x  |   Tile shape 4x  |   Tile shape 8x  |   Tile shape 16x  |
        //  |-------------|------------------|------------------|------------------|-------------------|
        //  |     8-Bit   |   128 x 256 x 1  |   128 x 128 x 1  |   64 x 128 x 1   |    64 x 64 x 1    |
        //  |    16-Bit   |   128 x 128 x 1  |   128 x  64 x 1  |   64 x  64 x 1   |    64 x 32 x 1    |
        //  |    32-Bit   |    64 x 128 x 1  |    64 x  64 x 1  |   32 x  64 x 1   |    32 x 32 x 1    |
        //  |    64-Bit   |    64 x  64 x 1  |    64 x  32 x 1  |   32 x  32 x 1   |    32 x 16 x 1    |
        //  |   128-Bit   |    32 x  64 x 1  |    32 x  32 x 1  |   16 x  32 x 1   |    16 x 16 x 1    |
        VERIFY_EXPR(IsPowerOfTwo(TexDesc.SampleCount));
        Props.TileSize[0] = 128 >> (TexDesc.SampleCount >= 8 ? 1 : 0);
        Props.TileSize[1] = 256 >> (TexDesc.SampleCount >= 4 ? (TexDesc.SampleCount >= 16 ? 2 : 1) : 0);
        Props.TileSize[2] = 1;

        constexpr size_t Remap[] = {1, 0};
        for (Uint32 i = 0; (1u << i) < TexelSize; ++i)
        {
            Props.TileSize[Remap[i & 1]] /= 2;
        }
    }
    else
    {
        Props.TileSize[0] = 256;
        Props.TileSize[1] = 256;
        Props.TileSize[2] = 1;
        if (FmtAttribs.ComponentType != COMPONENT_TYPE_COMPRESSED)
        {
            //  | Texel size  |    Tile shape   |
            //  |-------------|-----------------|
            //  |     8-Bit   |  256 x 256 x 1  |
            //  |    16-Bit   |  256 x 128 x 1  |
            //  |    32-Bit   |  128 x 128 x 1  |
            //  |    64-Bit   |  128 x  64 x 1  |
            //  |   128-Bit   |   64 x  64 x 1  |
            constexpr size_t Remap[] = {1, 0};
            for (Uint32 i = 0; (1u << i) < TexelSize; ++i)
            {
                Props.TileSize[Remap[i & 1]] /= 2;
            }
        }
        else
        {
            for (Uint32 i = 0; (FmtAttribs.ComponentSize << i) < (FmtAttribs.BlockWidth * FmtAttribs.BlockHeight); ++i)
            {
                Props.TileSize[i & 1] *= 2;
            }
        }
    }

    const Uint32 BytesPerTile =
        (Props.TileSize[0] / FmtAttribs.BlockWidth) *
        (Props.TileSize[1] / FmtAttribs.BlockHeight) *
        Props.TileSize[2] * TexDesc.SampleCount * TexelSize;
    VERIFY_EXPR(BytesPerTile == SparseBlockSize);

    Uint64 SliceSize     = 0;
    Props.FirstMipInTail = ~0u;
    for (Uint32 Mip = 0; Mip < TexDesc.MipLevels; ++Mip)
    {
        const MipLevelProperties MipProps  = GetMipLevelProperties(TexDesc, Mip);
        const Uint32             MipWidth  = MipProps.StorageWidth;
        const Uint32             MipHeight = MipProps.StorageHeight;
        const Uint32             MipDepth  = MipProps.Depth;

        // When the size of a texture mipmap level is at least one standard tile shape for its
        // format, the mipmap level is guaranteed to be nonpacked.
        const bool IsUnpacked =
            MipWidth >= Props.TileSize[0] &&
            MipHeight >= Props.TileSize[1] &&
            MipDepth >= Props.TileSize[2];

        if (!IsUnpacked)
        {
            // Mip tail
            if (Props.FirstMipInTail == ~0u)
            {
                Props.FirstMipInTail = Mip;
                Props.MipTailOffset  = SliceSize;
            }
            Props.MipTailSize += MipProps.MipSize;
        }
        else
        {
            const uint3 NumTilesInMip = GetNumSparseTilesInBox(Box{0, MipWidth, 0, MipHeight, 0, MipDepth}, Props.TileSize);
            SliceSize += Uint64{NumTilesInMip.x} * NumTilesInMip.y * NumTilesInMip.z * SparseBlockSize;
        }
    }

    Props.FirstMipInTail   = std::min(Props.FirstMipInTail, TexDesc.MipLevels);
    Props.MipTailSize      = AlignUp(Props.MipTailSize, SparseBlockSize);
    SliceSize              = SliceSize + Props.MipTailSize;
    Props.MipTailStride    = TexDesc.IsArray() ? SliceSize : 0;
    Props.AddressSpaceSize = SliceSize * TexDesc.GetArraySize();
    Props.BlockSize        = SparseBlockSize;
    Props.Flags            = SPARSE_TEXTURE_FLAG_NONE;

    VERIFY_EXPR(Props.MipTailSize % SparseBlockSize == 0);
    VERIFY_EXPR(Props.MipTailStride % SparseBlockSize == 0);
    VERIFY_EXPR(Props.AddressSpaceSize % SparseBlockSize == 0);

    return Props;
}